

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

int send_twin_operation_request
              (TWIN_MESSENGER_INSTANCE_conflict *twin_msgr,TWIN_OPERATION_CONTEXT *op_ctx,
              CONSTBUFFER_HANDLE data)

{
  TWIN_OPERATION_TYPE TVar1;
  int iVar2;
  int iVar3;
  MESSAGE_HANDLE message;
  AMQP_VALUE pAVar4;
  LOGGER_LOG p_Var5;
  time_t tVar6;
  CONSTBUFFER *pCVar7;
  char *pcVar8;
  size_t sVar9;
  uchar *puVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  BINARY_DATA amqp_data;
  PROPERTIES_HANDLE local_40;
  AMQP_VALUE local_38;
  
  TVar1 = op_ctx->type;
  if (TVar1 - TWIN_OPERATION_TYPE_PATCH < 5) {
    pcVar8 = op_ctx->correlation_id;
    pcVar11 = *(char **)(&DAT_001d9c00 + (ulong)(TVar1 - TWIN_OPERATION_TYPE_PATCH) * 8);
    message = message_create();
    if (message != (MESSAGE_HANDLE)0x0) {
      pAVar4 = amqpvalue_create_map();
      if (pAVar4 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_amqp_message_for_twin_operation",0x2f6,1,
                    "Failed creating map for message annotations");
        }
        message_destroy(message);
        goto LAB_001392a5;
      }
      local_38 = pAVar4;
      iVar2 = add_map_item(pAVar4,"operation",pcVar11);
      if (iVar2 == 0) {
        if (TVar1 != TWIN_OPERATION_TYPE_PATCH) {
          if (((TVar1 & (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET)) !=
               TWIN_OPERATION_TYPE_PUT) ||
             (iVar2 = add_map_item(local_38,"resource","/notifications/twin/properties/desired"),
             iVar2 == 0)) goto LAB_00139422;
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed adding resource to AMQP message annotations (%s)";
            iVar2 = 0x30c;
            goto LAB_0013914d;
          }
          goto LAB_00139152;
        }
        iVar2 = add_map_item(local_38,"resource","/properties/reported");
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed adding resource to AMQP message annotations (%s)";
            iVar2 = 0x305;
            goto LAB_0013914d;
          }
          goto LAB_00139152;
        }
LAB_00139422:
        pAVar4 = amqpvalue_create_message_annotations(local_38);
        if (pAVar4 == (AMQP_VALUE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"add_amqp_message_annotation",0x13d,1,
                      "Failed creating new AMQP message annotations");
          }
LAB_001394fb:
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed adding annotations to AMQP message (%s)";
            iVar2 = 0x312;
            goto LAB_0013914d;
          }
          goto LAB_00139152;
        }
        iVar2 = message_set_message_annotations(message,pAVar4);
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"add_amqp_message_annotation",0x144,1,
                      "Failed setting AMQP message annotations");
          }
          amqpvalue_destroy(pAVar4);
          goto LAB_001394fb;
        }
        amqpvalue_destroy(pAVar4);
        local_40 = (PROPERTIES_HANDLE)0x0;
        iVar2 = message_get_properties(message,&local_40);
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed getting the AMQP message properties";
            iVar2 = 0xac;
LAB_001395d7:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"set_message_correlation_id",iVar2,1,pcVar11);
          }
LAB_001396dd:
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed AMQP message correlation-id (%s)";
            iVar2 = 0x318;
            goto LAB_0013914d;
          }
          goto LAB_00139152;
        }
        if ((local_40 == (PROPERTIES_HANDLE)0x0) &&
           (local_40 = properties_create(), local_40 == (PROPERTIES_HANDLE)0x0)) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed creating properties for AMQP message";
            iVar2 = 0xb1;
            goto LAB_001395d7;
          }
          goto LAB_001396dd;
        }
        pAVar4 = amqpvalue_create_string(pcVar8);
        if (pAVar4 == (AMQP_VALUE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"set_message_correlation_id",0xba,1,
                      "Failed creating AMQP value for correlation-id");
          }
LAB_001396d3:
          properties_destroy(local_40);
          goto LAB_001396dd;
        }
        iVar2 = properties_set_correlation_id(local_40,pAVar4);
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed setting the correlation id";
            iVar2 = 0xc1;
LAB_001396c6:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"set_message_correlation_id",iVar2,1,pcVar11);
          }
LAB_001396cb:
          amqpvalue_destroy(pAVar4);
          goto LAB_001396d3;
        }
        iVar2 = message_set_properties(message,local_40);
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed setting the AMQP message properties";
            iVar2 = 0xc6;
            goto LAB_001396c6;
          }
          goto LAB_001396cb;
        }
        amqpvalue_destroy(pAVar4);
        properties_destroy(local_40);
        if (data == (CONSTBUFFER_HANDLE)0x0) {
          sVar9 = 1;
          puVar10 = " ";
        }
        else {
          pCVar7 = CONSTBUFFER_GetContent(data);
          puVar10 = pCVar7->buffer;
          sVar9 = pCVar7->size;
        }
        amqp_data.length = sVar9;
        amqp_data.bytes = puVar10;
        iVar2 = message_add_body_amqp_data(message,amqp_data);
        if (iVar2 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed adding twin patch data to AMQP message body";
            iVar2 = 0x32f;
            goto LAB_0013914d;
          }
          goto LAB_00139152;
        }
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00139152;
        pcVar11 = "Failed adding operation to AMQP message annotations (%s)";
        iVar2 = 0x2fe;
LAB_0013914d:
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"create_amqp_message_for_twin_operation",iVar2,1,pcVar11);
LAB_00139152:
        message_destroy(message);
        message = (MESSAGE_HANDLE)0x0;
      }
      amqpvalue_destroy(local_38);
      if (message != (MESSAGE_HANDLE)0x0) {
        iVar2 = 0;
        tVar6 = get_time((time_t *)0x0);
        op_ctx->time_sent = tVar6;
        if (tVar6 == -1) {
          p_Var5 = xlogging_get_log_function();
          iVar2 = 0x3c5;
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013957c;
          pcVar11 = twin_msgr->device_id;
          if ((ulong)op_ctx->type < 6) {
            pcVar8 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
          }
          else {
            pcVar8 = "NULL";
          }
          pcVar12 = op_ctx->correlation_id;
          pcVar13 = "Failed setting TWIN operation sent time (%s, %s, %s)";
          iVar3 = 0x3c4;
        }
        else {
          iVar3 = amqp_messenger_send_async
                            (twin_msgr->amqp_msgr,message,on_amqp_send_complete_callback,op_ctx);
          if (iVar3 == 0) goto LAB_0013957c;
          p_Var5 = xlogging_get_log_function();
          iVar2 = 0x3ca;
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013957c;
          pcVar11 = twin_msgr->device_id;
          if ((ulong)op_ctx->type < 6) {
            pcVar8 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
          }
          else {
            pcVar8 = "NULL";
          }
          pcVar12 = op_ctx->correlation_id;
          pcVar13 = "Failed sending request message for (%s, %s, %s)";
          iVar3 = 0x3c9;
        }
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"send_twin_operation_request",iVar3,1,pcVar13,pcVar11,pcVar8,pcVar12);
LAB_0013957c:
        message_destroy(message);
        return iVar2;
      }
      goto LAB_001392a5;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001392a5;
    pcVar8 = "create_amqp_message_for_twin_operation";
    pcVar12 = "Failed creating AMQP message (%s)";
    iVar2 = 0x2ee;
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001392a5;
    if (TVar1 < (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET)) {
      pcVar11 = TWIN_OPERATION_TYPEStringStorage[TVar1];
    }
    else {
      pcVar11 = "NULL";
    }
    pcVar8 = "get_twin_operation_name";
    pcVar12 = "Unrecognized TWIN operation (%s)";
    iVar2 = 0x2ce;
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,pcVar8,iVar2,1,pcVar12,pcVar11);
LAB_001392a5:
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 != (LOGGER_LOG)0x0) {
    if ((ulong)op_ctx->type < 6) {
      pcVar11 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
    }
    else {
      pcVar11 = "NULL";
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"send_twin_operation_request",0x3bd,1,"Failed creating request message (%s, %s, %s)",
              twin_msgr->device_id,pcVar11,op_ctx->correlation_id);
  }
  return 0x3be;
}

Assistant:

static int send_twin_operation_request(TWIN_MESSENGER_INSTANCE* twin_msgr, TWIN_OPERATION_CONTEXT* op_ctx, CONSTBUFFER_HANDLE data)
{
    int result;
    MESSAGE_HANDLE amqp_message;

    if ((amqp_message = create_amqp_message_for_twin_operation(op_ctx->type, op_ctx->correlation_id, data)) == NULL)
    {
        LogError("Failed creating request message (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        if ((op_ctx->time_sent = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed setting TWIN operation sent time (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else if (amqp_messenger_send_async(twin_msgr->amqp_msgr, amqp_message, on_amqp_send_complete_callback, (void*)op_ctx) != 0)
        {
            LogError("Failed sending request message for (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }

        message_destroy(amqp_message);
    }

    return result;
}